

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnExport
          (BinaryReaderObjdump *this,Index index,ExternalKind kind,Index item_index,string_view name
          )

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pcVar4;
  undefined1 local_48 [8];
  string_view name_1;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdump *)name.data_;
  name_1.size_._4_4_ = item_index;
  pcVar2 = GetKindName(kind);
  PrintDetails(this," - %s[%u]",pcVar2,(ulong)name_1.size_._4_4_);
  if (kind == First) {
    _local_48 = BinaryReaderObjdumpBase::GetFunctionName
                          (&this->super_BinaryReaderObjdumpBase,name_1.size_._4_4_);
    bVar1 = string_view::empty((string_view *)local_48);
    if (!bVar1) {
      sVar3 = string_view::length((string_view *)local_48);
      pcVar4 = string_view::data((string_view *)local_48);
      PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pcVar4);
    }
  }
  sVar3 = string_view::length((string_view *)&this_local);
  pcVar4 = string_view::data((string_view *)&this_local);
  PrintDetails(this," -> \"%.*s\"\n",sVar3 & 0xffffffff,pcVar4);
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnExport(Index index,
                                     ExternalKind kind,
                                     Index item_index,
                                     string_view name) {
  PrintDetails(" - %s[%" PRIindex "]", GetKindName(kind), item_index);
  if (kind == ExternalKind::Func) {
    auto name = GetFunctionName(item_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
  }

  PrintDetails(" -> \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(name));
  return Result::Ok;
}